

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CGL::outer(Vector4D *u,Vector4D *v)

{
  double dVar1;
  double *pdVar2;
  Vector4D *in_RDX;
  Vector4D *in_RSI;
  Matrix4x4 *in_RDI;
  int j;
  int i;
  Matrix4x4 *B;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Matrix4x4 *this;
  int local_20;
  int local_1c;
  Vector4D *local_18;
  Vector4D *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Matrix4x4::Matrix4x4(in_RDI);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      pdVar2 = Vector4D::operator[](local_10,&local_1c);
      this = (Matrix4x4 *)*pdVar2;
      pdVar2 = Vector4D::operator[](local_18,&local_20);
      dVar1 = *pdVar2;
      pdVar2 = Matrix4x4::operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      *pdVar2 = (double)this * dVar1;
    }
  }
  return in_RDI;
}

Assistant:

Matrix4x4 outer(const Vector4D &u, const Vector4D &v) {
  Matrix4x4 B;

  // Opposite of an inner product.
  for (int i = 0; i < 4; i++)
    for (int j = 0; j < 4; j++) {
      B(i, j) = u[i] * v[j];
    }

  return B;
}